

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  long lVar3;
  long lVar4;
  
  pSVar2 = (this->super_ServiceGenerator).descriptor_;
  if (0 < *(int *)(pSVar2 + 0x28)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(pSVar2 + 0x20);
      WriteMethodDocComment(printer,(MethodDescriptor *)(lVar1 + lVar4));
      GenerateMethodSignature(this,printer,(MethodDescriptor *)(lVar1 + lVar4),IS_ABSTRACT);
      io::Printer::Print<>(printer,";\n\n");
      lVar3 = lVar3 + 1;
      pSVar2 = (this->super_ServiceGenerator).descriptor_;
      lVar4 = lVar4 + 0x68;
    } while (lVar3 < *(int *)(pSVar2 + 0x28));
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method);
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}